

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * targetSrcList(Parse *pParse,TriggerStep *pStep)

{
  uint uVar1;
  sqlite3 *db;
  Schema *pSVar2;
  SrcList *pSVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  Schema **ppSVar7;
  
  db = pParse->db;
  pSVar3 = sqlite3SrcListAppend(db,(SrcList *)0x0,(Token *)0x0,(Token *)0x0);
  if (pSVar3 != (SrcList *)0x0) {
    pcVar4 = sqlite3DbStrDup(db,pStep->zTarget);
    pSVar3->a[(long)pSVar3->nSrc + -1].zName = pcVar4;
    pSVar2 = pStep->pTrig->pSchema;
    if (pSVar2 == (Schema *)0x0) {
      uVar6 = 0xfff0bdc0;
    }
    else {
      uVar1 = db->nDb;
      if ((int)uVar1 < 1) {
        uVar6 = 0;
      }
      else {
        ppSVar7 = &db->aDb->pSchema;
        uVar5 = 0;
        do {
          uVar6 = uVar5;
          if (*ppSVar7 == pSVar2) break;
          uVar5 = uVar5 + 1;
          ppSVar7 = ppSVar7 + 4;
          uVar6 = (ulong)uVar1;
        } while (uVar1 != uVar5);
      }
    }
    if ((int)uVar6 == 0 || 1 < (int)uVar6) {
      pcVar4 = sqlite3DbStrDup(db,db->aDb[uVar6 & 0xffffffff].zDbSName);
      pSVar3->a[(long)pSVar3->nSrc + -1].zDatabase = pcVar4;
    }
  }
  return pSVar3;
}

Assistant:

static SrcList *targetSrcList(
  Parse *pParse,       /* The parsing context */
  TriggerStep *pStep   /* The trigger containing the target token */
){
  sqlite3 *db = pParse->db;
  int iDb;             /* Index of the database to use */
  SrcList *pSrc;       /* SrcList to be returned */

  pSrc = sqlite3SrcListAppend(db, 0, 0, 0);
  if( pSrc ){
    assert( pSrc->nSrc>0 );
    pSrc->a[pSrc->nSrc-1].zName = sqlite3DbStrDup(db, pStep->zTarget);
    iDb = sqlite3SchemaToIndex(db, pStep->pTrig->pSchema);
    if( iDb==0 || iDb>=2 ){
      const char *zDb;
      assert( iDb<db->nDb );
      zDb = db->aDb[iDb].zDbSName;
      pSrc->a[pSrc->nSrc-1].zDatabase =  sqlite3DbStrDup(db, zDb);
    }
  }
  return pSrc;
}